

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTexture.cpp
# Opt level: O2

void __thiscall chrono::ChTexture::ArchiveIN(ChTexture *this,ChArchiveIn *marchive)

{
  ChNameValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  
  ChArchiveIn::VersionRead<chrono::ChTexture>(marchive);
  local_28._name = "m_filename";
  local_28._flags = '\0';
  local_28._value = &this->m_filename;
  ChArchiveIn::operator>>(marchive,&local_28);
  return;
}

Assistant:

void ChTexture::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/marchive.VersionRead<ChTexture>();
    // stream in all member data:
    marchive >> CHNVP(m_filename);
}